

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::iterator::skip_empty(iterator *this)

{
  Inner *pIVar1;
  Inner *pIVar2;
  ctrl_t *pcVar3;
  ctrl_t *pcVar4;
  iterator iVar5;
  
  pcVar3 = (this->it_).ctrl_;
  pcVar4 = (this->it_end_).ctrl_;
  while( true ) {
    if (pcVar3 != pcVar4) {
      return;
    }
    pIVar2 = this->inner_;
    pIVar1 = pIVar2 + 1;
    this->inner_ = pIVar1;
    if (pIVar1 == this->inner_end_) break;
    iVar5 = raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::begin(&pIVar2[1].set_);
    pcVar3 = iVar5.ctrl_;
    (this->it_).ctrl_ = iVar5.ctrl_;
    (this->it_).field_1 = iVar5.field_1;
    pcVar4 = (this->inner_->set_).ctrl_ + (this->inner_->set_).capacity_;
    (this->it_end_).ctrl_ = pcVar4;
  }
  this->inner_ = (Inner *)0x0;
  return;
}

Assistant:

void skip_empty() {
            while (it_ == it_end_) {
                ++inner_;
                if (inner_ == inner_end_) {
                    inner_ = nullptr; // marks end()
                    break;
                }
                else {
                    it_ = inner_->set_.begin();
                    it_end_ = inner_->set_.end();
                }
            }
        }